

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *value)

{
  void *pvVar1;
  string *psVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Message **v1;
  void **ppvVar6;
  LogMessage *pLVar7;
  Arena *value_arena;
  Arena *my_arena;
  Rep *pRVar8;
  undefined1 auVar9 [16];
  void **elems;
  Arena *arena;
  Arena *element_arena;
  LogMessageFatal local_40 [23];
  Voidify local_29;
  void *local_28;
  string *local_20;
  string *absl_log_internal_check_op_result;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *value_local;
  RepeatedPtrFieldBase *this_local;
  
  absl_log_internal_check_op_result = (string *)value;
  value_local = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *
                )this;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Message*>
                 ((Message **)&absl_log_internal_check_op_result);
  local_28 = (void *)0x0;
  ppvVar6 = absl::lts_20240722::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_28);
  local_20 = absl::lts_20240722::log_internal::
             Check_NEImpl<google::protobuf::Message*,decltype(nullptr)>
                       (v1,ppvVar6,"value != nullptr");
  if (local_20 != (string *)0x0) {
    auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0x198,auVar9._0_8_,auVar9._8_8_);
    pLVar7 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar7);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  value_arena = GenericTypeHandler<google::protobuf::Message>::GetArena
                          ((Message *)absl_log_internal_check_op_result);
  my_arena = GetArena(this);
  if ((my_arena == value_arena) && (bVar3 = AllocatedSizeAtCapacity(this), !bVar3)) {
    ppvVar6 = elements(this);
    iVar5 = this->current_size_;
    iVar4 = allocated_size(this);
    if (iVar5 < iVar4) {
      pvVar1 = ppvVar6[this->current_size_];
      iVar5 = allocated_size(this);
      ppvVar6[iVar5] = pvVar1;
    }
    psVar2 = absl_log_internal_check_op_result;
    iVar5 = ExchangeCurrentSize(this,this->current_size_ + 1);
    ppvVar6[iVar5] = psVar2;
    bVar3 = using_sso(this);
    if (bVar3) {
      return;
    }
    pRVar8 = rep(this);
    pRVar8->allocated_size = pRVar8->allocated_size + 1;
    return;
  }
  AddAllocatedSlowWithCopy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (this,(Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_>
                   *)absl_log_internal_check_op_result,value_arena,my_arena);
  return;
}

Assistant:

void AddAllocated(Value<TypeHandler>* value) {
    ABSL_DCHECK_NE(value, nullptr);
    Arena* element_arena = TypeHandler::GetArena(value);
    Arena* arena = GetArena();
    if (arena != element_arena || AllocatedSizeAtCapacity()) {
      AddAllocatedSlowWithCopy<TypeHandler>(value, element_arena, arena);
      return;
    }
    // Fast path: underlying arena representation (tagged pointer) is equal to
    // our arena pointer, and we can add to array without resizing it (at
    // least one slot that is not allocated).
    void** elems = elements();
    if (current_size_ < allocated_size()) {
      // Make space at [current] by moving first allocated element to end of
      // allocated list.
      elems[allocated_size()] = elems[current_size_];
    }
    elems[ExchangeCurrentSize(current_size_ + 1)] = value;
    if (!using_sso()) ++rep()->allocated_size;
  }